

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void spvtools::opt::anon_unknown_0::CreateDecoration
               (DecorationManager *decoration_mgr,uint32_t var_id,Decoration decoration,
               uint32_t literal)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<spvtools::opt::Operand> __l;
  Operand *local_1b8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_1b0;
  allocator<spvtools::opt::Operand> local_195;
  uint32_t local_194;
  iterator local_190;
  undefined8 local_188;
  SmallVector<unsigned_int,_2UL> local_180;
  Decoration local_154;
  Decoration *local_150;
  undefined8 local_148;
  SmallVector<unsigned_int,_2UL> local_140;
  uint32_t local_114;
  iterator local_110;
  undefined8 local_108;
  SmallVector<unsigned_int,_2UL> local_100;
  Operand local_d8;
  Operand OStack_a8;
  Operand OStack_78;
  iterator local_48;
  _func_int **local_40;
  undefined1 local_38 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  uint32_t literal_local;
  Decoration decoration_local;
  uint32_t var_id_local;
  DecorationManager *decoration_mgr_local;
  
  local_110 = &local_114;
  local_108 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_110;
  local_114 = var_id;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = literal;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list_01);
  Operand::Operand(&local_d8,SPV_OPERAND_TYPE_ID,&local_100);
  local_150 = &local_154;
  local_148 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_150;
  local_154 = decoration;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_140,init_list_00);
  Operand::Operand(&OStack_a8,SPV_OPERAND_TYPE_DECORATION,&local_140);
  local_194 = operands.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  local_190 = &local_194;
  local_188 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_190;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_180,init_list);
  Operand::Operand(&OStack_78,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_180);
  local_48 = &local_d8;
  local_40 = (_func_int **)0x3;
  std::allocator<spvtools::opt::Operand>::allocator(&local_195);
  __l._M_len = (size_type)local_40;
  __l._M_array = local_48;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_38,__l
             ,&local_195);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_195);
  local_1b8 = (Operand *)&local_48;
  do {
    local_1b8 = local_1b8 + -1;
    Operand::~Operand(local_1b8);
  } while (local_1b8 != &local_d8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_180);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_140);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_1b0,
             (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_38);
  analysis::DecorationManager::AddDecoration(decoration_mgr,OpDecorate,&local_1b0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_1b0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_38);
  return;
}

Assistant:

void CreateDecoration(analysis::DecorationManager* decoration_mgr,
                      uint32_t var_id, spv::Decoration decoration,
                      uint32_t literal) {
  std::vector<Operand> operands({
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {var_id}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_DECORATION,
       {static_cast<uint32_t>(decoration)}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {literal}},
  });
  decoration_mgr->AddDecoration(spv::Op::OpDecorate, std::move(operands));
}